

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O0

bool __thiscall QDeviceDiscoveryUDev::checkDeviceType(QDeviceDiscoveryUDev *this,udev_device *dev)

{
  Int IVar1;
  int iVar2;
  char *pcVar3;
  quint64 qVar4;
  long in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  QByteArrayView QVar6;
  bool test;
  unsigned_long_long keys;
  bool ok;
  QList<QStringView> val;
  QString capabilities_key;
  undefined4 in_stack_ffffffffffffff28;
  SplitBehaviorFlags in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff39;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  undefined1 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar7;
  byte local_91;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_90;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_8c;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_88;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_84;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_80;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_7c;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_78;
  byte local_71;
  QChar local_6a;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  storage_type *local_38;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    local_91 = 0;
    goto LAB_001137aa;
  }
  local_c.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
       (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
       QFlags<QDeviceDiscovery::QDeviceType>::operator&
                 ((QFlags<QDeviceDiscovery::QDeviceType> *)
                  CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  uVar7 = false;
  if (IVar1 != 0) {
    pcVar3 = (char *)udev_device_get_property_value(in_RSI,"ID_INPUT_KEYBOARD");
    iVar2 = qstrcmp(pcVar3,"1");
    uVar7 = iVar2 == 0;
  }
  if ((bool)uVar7 != false) {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_40 = udev_device_get_sysattr_value(in_RSI,"capabilities/key");
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)in_RDI,
               (char **)CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff3e,
                                                CONCAT15(in_stack_ffffffffffffff3d,
                                                         CONCAT14(in_stack_ffffffffffffff3c,
                                                                  CONCAT13(in_stack_ffffffffffffff3b
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffff3a,
                                                  CONCAT11(in_stack_ffffffffffffff39,
                                                           in_stack_ffffffffffffff38))))))));
    QVar6.m_data = local_38;
    QVar6.m_size = (qsizetype)&local_28;
    QString::fromUtf8(QVar6);
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>
              (in_RDI,(QString *)
                      CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff3e,
                                              CONCAT15(in_stack_ffffffffffffff3d,
                                                       CONCAT14(in_stack_ffffffffffffff3c,
                                                                CONCAT13(in_stack_ffffffffffffff3b,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffff3a,
                                                  CONCAT11(in_stack_ffffffffffffff39,
                                                           in_stack_ffffffffffffff38))))))));
    QChar::QChar<char16_t,_true>(&local_6a,L' ');
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c);
    QStringView::split((QChar)(char16_t)&local_58,(QFlags *)local_68,(uint)(ushort)local_6a.ucs);
    bVar5 = QList<QStringView>::isEmpty((QList<QStringView> *)0x113423);
    if (bVar5) {
LAB_0011348b:
      bVar5 = false;
    }
    else {
      local_71 = 0xaa;
      QList<QStringView>::last
                ((QList<QStringView> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                );
      qVar4 = QStringView::toULongLong
                        ((QStringView *)
                         CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff3e,
                                                 CONCAT15(in_stack_ffffffffffffff3d,
                                                          CONCAT14(in_stack_ffffffffffffff3c,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff3b,
                                                  CONCAT12(in_stack_ffffffffffffff3a,
                                                           CONCAT11(in_stack_ffffffffffffff39,
                                                                    in_stack_ffffffffffffff38)))))))
                         ,(bool *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff2c);
      if (((local_71 & 1) == 0) || ((qVar4 >> 0x10 & 1) == 0)) goto LAB_0011348b;
      local_91 = 1;
      bVar5 = true;
    }
    QList<QStringView>::~QList((QList<QStringView> *)0x1134a0);
    QString::~QString((QString *)0x1134ad);
    if (bVar5) goto LAB_001137aa;
  }
  local_78.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
       (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
       QFlags<QDeviceDiscovery::QDeviceType>::operator&
                 ((QFlags<QDeviceDiscovery::QDeviceType> *)
                  CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_78);
  bVar5 = false;
  if (IVar1 != 0) {
    pcVar3 = (char *)udev_device_get_property_value(in_RSI,"ID_INPUT_KEY");
    iVar2 = qstrcmp(pcVar3,"1");
    bVar5 = iVar2 == 0;
  }
  if (bVar5) {
    local_91 = 1;
  }
  else {
    local_7c.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
         (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
         QFlags<QDeviceDiscovery::QDeviceType>::operator&
                   ((QFlags<QDeviceDiscovery::QDeviceType> *)
                    CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
    IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
    bVar5 = false;
    if (IVar1 != 0) {
      pcVar3 = (char *)udev_device_get_property_value(in_RSI,"ID_INPUT_MOUSE");
      iVar2 = qstrcmp(pcVar3,"1");
      bVar5 = iVar2 == 0;
    }
    if (bVar5) {
      local_91 = 1;
    }
    else {
      local_80.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
           (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
           QFlags<QDeviceDiscovery::QDeviceType>::operator&
                     ((QFlags<QDeviceDiscovery::QDeviceType> *)
                      CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff2c);
      IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_80);
      bVar5 = false;
      if (IVar1 != 0) {
        pcVar3 = (char *)udev_device_get_property_value(in_RSI,"ID_INPUT_TOUCHPAD");
        iVar2 = qstrcmp(pcVar3,"1");
        bVar5 = iVar2 == 0;
      }
      if (bVar5) {
        local_91 = 1;
      }
      else {
        local_84.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
             (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
             QFlags<QDeviceDiscovery::QDeviceType>::operator&
                       ((QFlags<QDeviceDiscovery::QDeviceType> *)
                        CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff2c);
        IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
        bVar5 = false;
        if (IVar1 != 0) {
          pcVar3 = (char *)udev_device_get_property_value(in_RSI,"ID_INPUT_TOUCHSCREEN");
          iVar2 = qstrcmp(pcVar3,"1");
          bVar5 = iVar2 == 0;
        }
        if (bVar5) {
          local_91 = 1;
        }
        else {
          local_88.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
               (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
               QFlags<QDeviceDiscovery::QDeviceType>::operator&
                         ((QFlags<QDeviceDiscovery::QDeviceType> *)
                          CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c);
          IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_88);
          bVar5 = false;
          if (IVar1 != 0) {
            pcVar3 = (char *)udev_device_get_property_value(in_RSI,"ID_INPUT_TABLET");
            iVar2 = qstrcmp(pcVar3,"1");
            bVar5 = iVar2 == 0;
          }
          if (bVar5) {
            local_91 = 1;
          }
          else {
            local_8c.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
                 (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
                 QFlags<QDeviceDiscovery::QDeviceType>::operator&
                           ((QFlags<QDeviceDiscovery::QDeviceType> *)
                            CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
            IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8c);
            bVar5 = false;
            if (IVar1 != 0) {
              pcVar3 = (char *)udev_device_get_property_value(in_RSI,"ID_INPUT_JOYSTICK");
              iVar2 = qstrcmp(pcVar3,"1");
              bVar5 = iVar2 == 0;
            }
            if (bVar5) {
              local_91 = 1;
            }
            else {
              local_90.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
                   (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
                   QFlags<QDeviceDiscovery::QDeviceType>::operator&
                             ((QFlags<QDeviceDiscovery::QDeviceType> *)
                              CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                              in_stack_ffffffffffffff2c);
              IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_90);
              bVar5 = false;
              if (IVar1 != 0) {
                pcVar3 = (char *)udev_device_get_subsystem(in_RSI);
                iVar2 = qstrcmp(pcVar3,"drm");
                bVar5 = iVar2 == 0;
              }
              if (bVar5) {
                local_91 = 1;
              }
              else {
                local_91 = 0;
              }
            }
          }
        }
      }
    }
  }
LAB_001137aa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_91 & 1);
}

Assistant:

bool QDeviceDiscoveryUDev::checkDeviceType(udev_device *dev)
{
    if (!dev)
        return false;

    if ((m_types & Device_Keyboard) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_KEYBOARD"), "1") == 0 )) {
        const QString capabilities_key = QString::fromUtf8(udev_device_get_sysattr_value(dev, "capabilities/key"));
        const auto val = QStringView{capabilities_key}.split(u' ', Qt::SkipEmptyParts);
        if (!val.isEmpty()) {
            bool ok;
            unsigned long long keys = val.last().toULongLong(&ok, 16);
            if (ok) {
                // Tests if the letter Q is valid for the device.  We may want to alter this test, but it seems mostly reliable.
                bool test = (keys >> KEY_Q) & 1;
                if (test)
                    return true;
            }
        }
    }

    if ((m_types & Device_Keyboard) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_KEY"), "1") == 0 ))
        return true;

    if ((m_types & Device_Mouse) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_MOUSE"), "1") == 0))
        return true;

    if ((m_types & Device_Touchpad) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TOUCHPAD"), "1") == 0))
        return true;

    if ((m_types & Device_Touchscreen) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TOUCHSCREEN"), "1") == 0))
        return true;

    if ((m_types & Device_Tablet) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TABLET"), "1") == 0))
        return true;

    if ((m_types & Device_Joystick) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_JOYSTICK"), "1") == 0))
        return true;

    if ((m_types & Device_DRM) && (qstrcmp(udev_device_get_subsystem(dev), "drm") == 0))
        return true;

    return false;
}